

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBucket::Verify(LargeHeapBucket *this)

{
  Recycler *recycler;
  LargeHeapBlock *heapBlock_3;
  LargeHeapBlock *pLVar1;
  LargeHeapBlock *heapBlock;
  
  recycler = ((this->super_HeapBucket).heapInfo)->recycler;
  for (pLVar1 = this->largeBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next) {
    LargeHeapBlock::Verify(pLVar1,recycler);
  }
  for (pLVar1 = this->largePageHeapBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next
      ) {
    LargeHeapBlock::Verify(pLVar1,recycler);
  }
  for (pLVar1 = this->fullLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next) {
    LargeHeapBlock::Verify(pLVar1,recycler);
  }
  for (pLVar1 = this->pendingDisposeLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    LargeHeapBlock::Verify(pLVar1,recycler);
  }
  return;
}

Assistant:

void
LargeHeapBucket::Verify()
{
    Recycler * recycler = this->heapInfo->recycler;
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->Verify(recycler);
    });
}